

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadArgumentElimination.cpp
# Opt level: O3

void __thiscall wasm::DAEScanner::~DAEScanner(DAEScanner *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pTVar2;
  pointer pcVar3;
  
  pTVar2 = (this->
           super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
           ).super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
           super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.stack.flexible.
           super__Vector_base<wasm::Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar2 != (pointer)0x0) {
    operator_delete(pTVar2,(long)*(pointer *)
                                  ((long)&(this->
                                          super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                                          ).
                                          super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>
                                          .
                                          super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>
                                          .stack.flexible.
                                          super__Vector_base<wasm::Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::Task>_>
                                          ._M_impl + 0x10) - (long)pTVar2);
  }
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>).
  super_Pass._vptr_Pass = (_func_int **)&PTR__Pass_00d722d8;
  pcVar3 = (this->
           super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
           ).super_Pass.name._M_dataplus._M_p;
  paVar1 = &(this->
            super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
            ).super_Pass.name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x120);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }